

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

SDL_Color GPU_MakeColor(Uint8 r,Uint8 g,Uint8 b,Uint8 a)

{
  undefined4 local_c;
  Uint8 a_local;
  Uint8 b_local;
  Uint8 g_local;
  Uint8 r_local;
  SDL_Color c;
  
  local_c._1_1_ = g;
  local_c._0_1_ = r;
  local_c._2_1_ = b;
  local_c._3_1_ = a;
  return local_c;
}

Assistant:

SDL_Color GPU_MakeColor(Uint8 r, Uint8 g, Uint8 b, Uint8 a)
{
    SDL_Color c;
    c.r = r;
    c.g = g;
    c.b = b;
    GET_ALPHA(c) = a;

    return c;
}